

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QVariant * __thiscall
QAbstractItemView::inputMethodQuery
          (QVariant *__return_storage_ptr__,QAbstractItemView *this,InputMethodQuery query)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  QEditorInfo *pQVar6;
  PrivateShared *pPVar7;
  QMetaType QVar8;
  QPoint QVar9;
  QWidget *this_01;
  ulong uVar10;
  long in_FS_OFFSET;
  QRect QVar11;
  QModelIndex local_78;
  QPoint local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  currentIndex(&local_78,this);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  if (((local_78.r < 0) || ((long)local_78._0_8_ < 0)) ||
     (local_78.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_0053aed8;
  if (this_00->waitForIMCommit == true) {
    pQVar6 = QAbstractItemViewPrivate::editorForIndex(this_00,&local_78);
    pDVar1 = (pQVar6->widget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      this_01 = (QWidget *)0x0;
    }
    else {
      this_01 = (QWidget *)(pQVar6->widget).wp.value;
    }
    if (this_01 == (QWidget *)0x0) goto LAB_0053ae0a;
    (**(code **)(*(long *)this_01 + 400))(&local_58,this_01,query);
    ::QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    iVar5 = ::QVariant::typeId(__return_storage_ptr__);
    if (iVar5 != 0x13) goto LAB_0053aed8;
    local_60 = (QPoint)&QtPrivate::QMetaTypeInterfaceWrapper<QRect>::metaType;
    local_58.shared =
         (PrivateShared *)(*(ulong *)&(__return_storage_ptr__->d).field_0x18 & 0xfffffffffffffffc);
    bVar4 = comparesEqual((QMetaType *)&local_58.shared,(QMetaType *)&local_60);
    if (bVar4) {
      pPVar7 = (PrivateShared *)__return_storage_ptr__;
      if (((__return_storage_ptr__->d).field_0x18 & 1) != 0) {
        pPVar7 = (__return_storage_ptr__->d).data.shared;
        pPVar7 = pPVar7 + *(int *)(pPVar7 + 4);
      }
      local_58.shared = (PrivateShared *)*(undefined8 *)&((Private *)&pPVar7->field_0x0)->data;
      local_58._8_8_ = *(undefined8 *)&pPVar7[8].field_0x0;
    }
    else {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = -1;
      QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      pPVar7 = (PrivateShared *)__return_storage_ptr__;
      if (((__return_storage_ptr__->d).field_0x18 & 1) != 0) {
        pPVar7 = (__return_storage_ptr__->d).data.shared;
        pPVar7 = pPVar7 + *(int *)(pPVar7 + 4);
      }
      QMetaType::convert(QVar8,pPVar7,(QMetaType)local_60,&local_58);
    }
    uVar3 = local_58._8_8_;
    uVar2 = local_58.shared;
    uVar10 = (ulong)local_58.shared & 0xffffffff00000000;
    local_60 = (QPoint)local_58.shared;
    QVar9 = QWidget::mapTo(this_01,(QWidget *)this,&local_60);
    uVar10 = (ulong)(uint)(QVar9.xp.m_i.m_i + ((int)uVar3 - (int)uVar2)) |
             (uVar3 - uVar10 & 0xffffffff00000000) + (long)QVar9 & 0xffffffff00000000;
    QVar11.x2.m_i = (int)uVar10;
    QVar11.y2.m_i = (int)(uVar10 >> 0x20);
    QVar11.x1.m_i = QVar9.xp.m_i;
    QVar11.y1.m_i = QVar9.yp.m_i;
  }
  else {
LAB_0053ae0a:
    if (query != ImCursorRectangle) goto LAB_0053aed8;
    QVar11 = (QRect)(**(code **)(*(long *)this + 0x1e0))(this,&local_78);
  }
  ::QVariant::QVariant((QVariant *)&local_58,QVar11);
  ::QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_0053aed8:
  if (*(ulong *)&(__return_storage_ptr__->d).field_0x18 < 4) {
    QWidget::inputMethodQuery((QVariant *)&local_58,(QWidget *)this,query);
    ::QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAbstractItemView::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QAbstractItemView);
    const QModelIndex current = currentIndex();
    QVariant result;
    if (current.isValid()) {
        if (QWidget *currentEditor;
            d->waitForIMCommit && (currentEditor = d->editorForIndex(current).widget)) {
            // An editor is open but the initial preedit is still ongoing. Delegate
            // queries to the editor and map coordinates from editor to this view.
            result = currentEditor->inputMethodQuery(query);
            if (result.typeId() == QMetaType::QRect) {
                const QRect editorRect = result.value<QRect>();
                result = QRect(currentEditor->mapTo(this, editorRect.topLeft()), editorRect.size());
            }
        } else if (query == Qt::ImCursorRectangle) {
            result = visualRect(current);
        }
    }
    if (!result.isValid())
        result = QAbstractScrollArea::inputMethodQuery(query);
    return result;
}